

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O0

void __thiscall
duckdb::ColumnSegment::ColumnSegment(ColumnSegment *this,ColumnSegment *other,idx_t start)

{
  SegmentBase<duckdb::ColumnSegment> *in_RDX;
  long in_RSI;
  idx_t in_RDI;
  LogicalType *other_00;
  SegmentStatistics *this_00;
  memory_order __b;
  LogicalType *in_stack_ffffffffffffffa0;
  
  ::std::operator&(memory_order_seq_cst,__memory_order_mask);
  SegmentBase<duckdb::ColumnSegment>::SegmentBase(in_RDX,in_RDI,(idx_t)in_stack_ffffffffffffffa0);
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RSI + 0x20);
  other_00 = (LogicalType *)(in_RDI + 0x28);
  LogicalType::LogicalType(in_stack_ffffffffffffffa0,other_00);
  *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RSI + 0x40);
  *(undefined1 *)(in_RDI + 0x48) = *(undefined1 *)(in_RSI + 0x48);
  this_00 = (SegmentStatistics *)(in_RDI + 0x50);
  SegmentStatistics::SegmentStatistics(this_00,(SegmentStatistics *)other_00);
  shared_ptr<duckdb::BlockHandle,_true>::shared_ptr
            ((shared_ptr<duckdb::BlockHandle,_true> *)this_00,
             (shared_ptr<duckdb::BlockHandle,_true> *)other_00);
  *(undefined8 *)(in_RDI + 0xb8) = *(undefined8 *)(in_RSI + 0xb8);
  *(undefined8 *)(in_RDI + 0xc0) = *(undefined8 *)(in_RSI + 0xc0);
  *(undefined8 *)(in_RDI + 200) = *(undefined8 *)(in_RSI + 200);
  *(undefined8 *)(in_RDI + 0xd0) = *(undefined8 *)(in_RSI + 0xd0);
  unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>,_true>
  ::unique_ptr((unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>,_true>
                *)this_00,
               (unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>,_true>
                *)other_00);
  return;
}

Assistant:

ColumnSegment::ColumnSegment(ColumnSegment &other, const idx_t start)

    : SegmentBase<ColumnSegment>(start, other.count.load()), db(other.db), type(std::move(other.type)),
      type_size(other.type_size), segment_type(other.segment_type), stats(std::move(other.stats)),
      block(std::move(other.block)), function(other.function), block_id(other.block_id), offset(other.offset),
      segment_size(other.segment_size), segment_state(std::move(other.segment_state)) {

	// For constant segments (CompressionType::COMPRESSION_CONSTANT) the block is a nullptr.
	D_ASSERT(!block || segment_size <= GetBlockManager().GetBlockSize());
}